

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initPh2ColCost(HModel *this,int firstcol,int lastcol)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double sense_col_cost;
  int var;
  int col;
  undefined4 local_14;
  
  for (local_14 = in_ESI; local_14 <= in_EDX; local_14 = local_14 + 1) {
    iVar2 = *(int *)(in_RDI + 0x61c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)local_14);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),(long)local_14);
    *pvVar3 = (double)iVar2 * dVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7c8),(long)local_14);
    *pvVar3 = 0.0;
  }
  return;
}

Assistant:

void HModel::initPh2ColCost(int firstcol, int lastcol) {
  // Copy the Phase 2 cost and zero the shift
  for (int col = firstcol; col <= lastcol; col++) {
    int var = col;
    double sense_col_cost = objSense*colCost[col];
    workCost[var] = sense_col_cost;
    workShift[var] = 0.;
  }
}